

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

string * testing::internal::FormatMatcherDescription
                   (string *__return_storage_ptr__,bool negation,char *matcher_name,
                   vector<const_char_*,_std::allocator<const_char_*>_> *param_names,
                   Strings *param_values)

{
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  ConvertIdentifierNameToWords_abi_cxx11_(&local_60,(internal *)matcher_name,matcher_name);
  if ((param_values->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (param_values->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    JoinAsKeyValueTuple(&local_40,param_names,param_values);
    std::operator+(&local_80," ",&local_40);
    std::__cxx11::string::append((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (negation) {
    std::operator+(&local_80,"not (",&local_60);
    std::operator+(__return_storage_ptr__,&local_80,")");
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ std::string FormatMatcherDescription(
    bool negation, const char* matcher_name,
    const std::vector<const char*>& param_names, const Strings& param_values) {
  std::string result = ConvertIdentifierNameToWords(matcher_name);
  if (!param_values.empty()) {
    result += " " + JoinAsKeyValueTuple(param_names, param_values);
  }
  return negation ? "not (" + result + ")" : result;
}